

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::batch_normalize_inference
               (double eps,resizable_tensor *dest,tensor *src,tensor *gamma,tensor *beta,
               tensor *running_means,tensor *running_variances)

{
  uint *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ostream *poVar10;
  fatal_error *this;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long k;
  long lVar16;
  double dVar17;
  string local_1c8;
  ostringstream dlib_o_out;
  uint auStack_190 [88];
  
  if (((((gamma->m_n == 1) && (gamma->m_nr == src->m_nr)) && (gamma->m_nc == src->m_nc)) &&
      ((gamma->m_k == src->m_k && (bVar5 = have_same_dimensions(gamma,beta), bVar5)))) &&
     ((bVar5 = have_same_dimensions(gamma,running_means), bVar5 &&
      ((bVar5 = have_same_dimensions(gamma,running_variances), 0.0 < eps && (bVar5)))))) {
    resizable_tensor::copy_size(dest,src);
    iVar6 = (*(dest->super_tensor)._vptr_tensor[3])(dest);
    lVar11 = CONCAT44(extraout_var,iVar6);
    iVar6 = (*src->_vptr_tensor[2])(src);
    lVar12 = CONCAT44(extraout_var_00,iVar6);
    iVar6 = (*gamma->_vptr_tensor[2])(gamma);
    iVar7 = (*beta->_vptr_tensor[2])(beta);
    iVar8 = (*running_means->_vptr_tensor[2])(running_means);
    iVar9 = (*running_variances->_vptr_tensor[2])(running_variances);
    lVar15 = src->m_nr * src->m_k * src->m_nc;
    lVar13 = 0;
    if (lVar15 < 1) {
      lVar15 = lVar13;
    }
    for (; lVar13 < src->m_n; lVar13 = lVar13 + 1) {
      lVar14 = 0;
      for (lVar16 = 0; lVar15 != lVar16; lVar16 = lVar16 + 1) {
        fVar2 = *(float *)(lVar12 + lVar16 * 4);
        fVar3 = *(float *)(CONCAT44(extraout_var_03,iVar8) + lVar16 * 4);
        fVar4 = *(float *)(CONCAT44(extraout_var_01,iVar6) + lVar16 * 4);
        dVar17 = (double)*(float *)(CONCAT44(extraout_var_04,iVar9) + lVar16 * 4) + eps;
        if (dVar17 < 0.0) {
          dVar17 = sqrt(dVar17);
        }
        else {
          dVar17 = SQRT(dVar17);
        }
        *(float *)(lVar11 + lVar16 * 4) =
             (float)((double)*(float *)(CONCAT44(extraout_var_02,iVar7) + lVar16 * 4) +
                    (double)((fVar2 - fVar3) * fVar4) / dVar17);
        lVar14 = lVar14 + -4;
      }
      lVar12 = lVar12 - lVar14;
      lVar11 = lVar11 - lVar14;
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x2ae);
  std::operator<<(poVar10,".\n");
  poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar10 = std::operator<<(poVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                           );
  std::operator<<(poVar10,".\n");
  poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar10 = std::operator<<(poVar10,
                            "void dlib::cpu::batch_normalize_inference(const double, resizable_tensor &, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &)"
                           );
  std::operator<<(poVar10,".\n\n");
  poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar10 = std::operator<<(poVar10,
                            "gamma.num_samples() == 1 && gamma.nr() == src.nr() && gamma.nc() == src.nc() && gamma.k() == src.k() && have_same_dimensions(gamma, beta) && have_same_dimensions(gamma, running_means) && have_same_dimensions(gamma, running_variances) && eps > 0"
                           );
  std::operator<<(poVar10,".\n");
  puVar1 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar10 = std::operator<<((ostream *)&dlib_o_out,"\ngamma.num_samples(): ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\ngamma.k():  ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\ngamma.nr(): ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\ngamma.nc(): ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nbeta.num_samples(): ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nbeta.k():   ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nbeta.nr():  ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nbeta.nc():  ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nrunning_means.num_samples(): ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nrunning_means.k():   ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nrunning_means.nr():  ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nrunning_means.nc():  ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nrunning_variances.num_samples(): ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nrunning_variances.k():   ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nrunning_variances.nr():  ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nrunning_variances.nc():  ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nsrc.k():   ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nsrc.nr():  ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  poVar10 = std::operator<<(poVar10,"\nsrc.nc():  ");
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::operator<<(poVar10,"\neps:  ");
  poVar10 = std::ostream::_M_insert<double>(eps);
  std::operator<<(poVar10,"\n");
  this = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this,EBROKEN_ASSERT,&local_1c8);
  __cxa_throw(this,&fatal_error::typeinfo,error::~error);
}

Assistant:

void batch_normalize_inference (
            const double eps,
            resizable_tensor& dest,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta,
            const tensor& running_means,
            const tensor& running_variances
        )
        {
            DLIB_CASSERT(
                gamma.num_samples() == 1 && 
                gamma.nr() == src.nr() &&
                gamma.nc() == src.nc() &&
                gamma.k()  == src.k() &&
                have_same_dimensions(gamma, beta) &&
                have_same_dimensions(gamma, running_means) &&
                have_same_dimensions(gamma, running_variances) && 
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nrunning_means.num_samples(): " << running_means.num_samples() << 
                "\nrunning_means.k():   " << running_means.k() << 
                "\nrunning_means.nr():  " << running_means.nr() << 
                "\nrunning_means.nc():  " << running_means.nc() << 
                "\nrunning_variances.num_samples(): " << running_variances.num_samples() << 
                "\nrunning_variances.k():   " << running_variances.k() << 
                "\nrunning_variances.nr():  " << running_variances.nr() << 
                "\nrunning_variances.nc():  " << running_variances.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc() <<
                "\neps:  " << eps 
            );
            dest.copy_size(src);

            auto d = dest.host();
            auto s = src.host();
            auto g = gamma.host();
            auto b = beta.host();
            auto m = running_means.host();
            auto v = running_variances.host();

            const long num = src.k()*src.nr()*src.nc();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < num; ++k)
                {
                    *d = g[k]*(*s - m[k])/std::sqrt(v[k]+eps) + b[k];
                    ++d;
                    ++s;
                }
            }
        }